

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

vec4 __thiscall CEditor::GetButtonColor(CEditor *this,void *pID,int Checked)

{
  void *pvVar1;
  undefined8 uVar2;
  vec4 vVar3;
  vec4 vVar4;
  
  if (Checked < 0) {
    return (vec4)(ZEXT816(0x3f00000000000000) << 0x40);
  }
  pvVar1 = (this->m_UI).m_pHotItem;
  if (Checked != 0) {
    if (pvVar1 == pID) {
      uVar2 = 0x3f40000000000000;
    }
    else {
      uVar2 = 0x3f00000000000000;
    }
    vVar3.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)(int)uVar2;
    vVar3.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)(int)((ulong)uVar2 >> 0x20);
    vVar3.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    vVar3.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
    return vVar3;
  }
  if (pvVar1 == pID) {
    uVar2 = 0x3f4000003f800000;
  }
  else {
    uVar2 = 0x3f0000003f800000;
  }
  vVar4.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)(int)uVar2;
  vVar4.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)(int)((ulong)uVar2 >> 0x20);
  vVar4.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  vVar4.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  return vVar4;
}

Assistant:

vec4 CEditor::GetButtonColor(const void *pID, int Checked)
{
	if(Checked < 0)
		return vec4(0,0,0,0.5f);

	if(Checked > 0)
	{
		if(UI()->HotItem() == pID)
			return vec4(1,0,0,0.75f);
		return vec4(1,0,0,0.5f);
	}

	if(UI()->HotItem() == pID)
		return vec4(1,1,1,0.75f);
	return vec4(1,1,1,0.5f);
}